

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O1

void __thiscall Liby::EventLoopGroup::run(EventLoopGroup *this,BoolFunctor *bf)

{
  allocator_type *paVar1;
  allocator_type *paVar2;
  thread *ptVar3;
  allocator_type *paVar4;
  int *in_RCX;
  int iVar5;
  thread *__cur;
  thread *ptVar6;
  new_allocator<std::thread> *this_00;
  allocator_type *__a;
  anon_class_8_1_8991fb9c_for__M_head_impl local_70;
  thread local_68;
  undefined8 uStack_60;
  code *local_58;
  code *local_50;
  EventLoopGroup *local_48;
  new_allocator<std::thread> *local_40;
  size_type local_38;
  
  local_68._M_id._M_thread = (id)0;
  uStack_60 = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:26:29)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:26:29)>
             ::_M_manager;
  Signal::signal(0xd,(__sighandler_t)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  std::function<bool_()>::operator=(&this->bf_,bf);
  if (0 < this->n_) {
    this_00 = (new_allocator<std::thread> *)&this->threads_;
    iVar5 = 0;
    local_48 = this;
    local_40 = this_00;
    do {
      iVar5 = iVar5 + 1;
      __a = *(allocator_type **)((long)this + 0x80);
      local_70.this._0_4_ = iVar5;
      local_68._M_id._M_thread = (id)(id)this;
      if (__a == *(allocator_type **)((long)this + 0x88)) {
        local_70.this._4_4_ = iVar5;
        local_38 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                             ((vector<std::thread,_std::allocator<std::thread>_> *)this_00,1,
                              "vector::_M_realloc_insert");
        paVar1 = (allocator_type *)
                 (((vector<std::thread,_std::allocator<std::thread>_> *)((long)this + 0x78))->
                 super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        paVar2 = *(allocator_type **)((long)this + 0x80);
        if (local_38 == 0) {
          ptVar3 = (thread *)0x0;
        }
        else {
          ptVar3 = __gnu_cxx::new_allocator<std::thread>::allocate(this_00,local_38,(void *)0x0);
        }
        in_RCX = (int *)((long)__a - (long)paVar1 >> 3);
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,Liby::EventLoopGroup::run(std::function<bool()>)::__1,int>
                  ((allocator_type *)(ptVar3 + (long)in_RCX),&local_68,&local_70,in_RCX);
        this = local_48;
        ptVar6 = ptVar3;
        for (paVar4 = paVar1; paVar4 != __a; paVar4 = paVar4 + 8) {
          (ptVar6->_M_id)._M_thread = 0;
          in_RCX = *(int **)paVar4;
          (ptVar6->_M_id)._M_thread = (native_handle_type)in_RCX;
          *(undefined8 *)paVar4 = 0;
          ptVar6 = ptVar6 + 1;
        }
        for (; ptVar6 = ptVar6 + 1, paVar2 != __a; __a = __a + 8) {
          (ptVar6->_M_id)._M_thread = 0;
          (ptVar6->_M_id)._M_thread = *(native_handle_type *)__a;
          *(undefined8 *)__a = 0;
        }
        if (paVar1 != (allocator_type *)0x0) {
          operator_delete(paVar1);
        }
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = ptVar3;
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar6;
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = ptVar3 + local_38;
        this_00 = local_40;
        iVar5 = local_70.this._4_4_;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,Liby::EventLoopGroup::run(std::function<bool()>)::__1,int>
                  (__a,&local_68,&local_70,in_RCX);
        *(pointer *)((long)this + 0x80U) = *(pointer *)((long)this + 0x80U) + 1;
      }
    } while (iVar5 < this->n_);
  }
  worker_thread(this,0);
  return;
}

Assistant:

void EventLoopGroup::run(BoolFunctor bf) {
    Signal::signal(SIGPIPE, [] { error("receive SIGPIPE"); });

    bf_ = bf;
    for (int i = 0; i < n_; i++) {
        threads_.emplace_back([this](int index) { worker_thread(index); },
                              i + 1);
    }

    worker_thread(0);
}